

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O0

void __thiscall polyscope::CurveNetwork::preparePick(CurveNetwork *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long *plVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  element_type *program;
  reference pvVar9;
  reference pvVar10;
  element_type *peVar11;
  long in_RDI;
  undefined8 uVar16;
  undefined1 extraout_var [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar14 [64];
  undefined8 uVar17;
  undefined1 auVar15 [64];
  vec3 vVar19;
  vec3 colorValEdge;
  vec3 colorValTip;
  vec3 colorValTail;
  size_t eTip;
  size_t eTail;
  size_t iE;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  edgePickEdge;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  edgePickTip;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  edgePickTail;
  vec3 val;
  size_t i;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  pickColors;
  size_t pickStart;
  size_t totalPickElements;
  value_type *in_stack_fffffffffffffa88;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffa90;
  allocator *this_00;
  allocator_type *in_stack_fffffffffffffaa0;
  allocator *paVar20;
  size_type in_stack_fffffffffffffaa8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffffab0;
  allocator_type *in_stack_fffffffffffffab8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *in_stack_fffffffffffffac0;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffac8;
  size_t in_stack_fffffffffffffae8;
  Structure *in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffb38 [16];
  ManagedBuffer<unsigned_int> *in_stack_fffffffffffffb50;
  CurveNetwork *in_stack_fffffffffffffb58;
  string *local_468;
  CurveNetwork *this_01;
  string *local_390;
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  undefined8 local_2d8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2d0;
  undefined8 local_2c4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2bc;
  undefined8 local_2b8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2b0;
  undefined8 local_2a8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_2a0;
  undefined8 local_298;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_290;
  undefined8 local_288;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_280;
  ulong local_278;
  ulong local_270;
  ulong local_268;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_258;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_238;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_218;
  undefined1 local_1fa;
  allocator local_1f9;
  string *local_1f8;
  string local_1f0 [32];
  string *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1a8 [31];
  allocator local_189;
  string local_188 [32];
  undefined1 local_168 [23];
  undefined1 local_151 [41];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_128;
  undefined8 local_120;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_118;
  undefined8 local_110;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_108;
  undefined8 local_100;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_f8;
  size_t local_f0;
  undefined1 local_e8 [30];
  undefined1 local_ca;
  allocator local_c9;
  string *local_c8;
  string local_c0 [32];
  string *local_a0;
  undefined8 local_98;
  undefined1 local_78 [47];
  allocator local_49;
  string local_48 [32];
  undefined1 local_28 [16];
  size_t local_18;
  long local_10;
  undefined1 auVar18 [56];
  
  render::ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(in_stack_fffffffffffffb50);
  render::ManagedBuffer<unsigned_int>::ensureHostBufferPopulated(in_stack_fffffffffffffb50);
  sVar6 = nNodes((CurveNetwork *)0x4ac15c);
  sVar7 = nEdges((CurveNetwork *)0x4ac171);
  local_10 = sVar6 + sVar7;
  local_18 = pick::requestPickBufferRange(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
  plVar4 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"RAYCAST_SPHERE",&local_49);
  local_ca = 1;
  local_c8 = local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"SPHERE_PROPAGATE_COLOR",&local_c9);
  local_ca = 0;
  local_a0 = local_c0;
  local_98 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x4ac275);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffac0,in_stack_fffffffffffffac8,in_stack_fffffffffffffab8);
  addCurveNetworkNodeRules
            (in_stack_fffffffffffffb58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb50);
  (**(code **)(*plVar4 + 0x158))(local_28,plVar4,local_48,local_78,2);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffa90,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffa88);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4ac318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffaa0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffaa0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x4ac33f);
  local_390 = (string *)&local_a0;
  do {
    local_390 = local_390 + -0x20;
    std::__cxx11::string::~string(local_390);
  } while (local_390 != local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string(local_48);
  auVar13._0_8_ = std::allocator<char>::~allocator((allocator<char> *)&local_49);
  auVar13._8_56_ = extraout_var;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)0x4ac3c5);
  nNodes((CurveNetwork *)0x4ac3d2);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::reserve(in_stack_fffffffffffffac0,(size_type)in_stack_fffffffffffffab8);
  local_f0 = local_18;
  while( true ) {
    sVar7 = local_18;
    sVar6 = local_f0;
    auVar18 = auVar13._8_56_;
    sVar8 = nNodes((CurveNetwork *)0x4ac430);
    if (sVar7 + sVar8 <= sVar6) break;
    vVar19 = pick::indToVec((size_t)in_stack_fffffffffffffac0);
    local_108 = vVar19.field_2;
    auVar12._0_8_ = vVar19._0_8_;
    auVar12._8_56_ = auVar18;
    uVar16 = 0;
    local_110 = vmovlpd_avx(auVar12._0_16_);
    local_100 = local_110;
    local_f8 = local_108;
    vVar19 = pick::indToVec((size_t)in_stack_fffffffffffffac0);
    local_128 = vVar19.field_2;
    auVar13 = ZEXT464((uint)local_128);
    auVar3._8_8_ = uVar16;
    auVar3._0_8_ = vVar19._0_8_;
    local_151._33_8_ = vmovlpd_avx(auVar3);
    local_120 = local_151._33_8_;
    local_118 = local_128;
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    local_f0 = local_f0 + 1;
  }
  program = std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4ac6fd);
  this_01 = (CurveNetwork *)local_151;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_151 + 1),"a_color",(allocator *)this_01);
  (*program->_vptr_ShaderProgram[0x15])(program,local_151 + 1,local_e8);
  std::__cxx11::string::~string((string *)(local_151 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_151);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffa90);
  fillNodeGeometryBuffers(in_stack_fffffffffffffb38._8_8_,in_stack_fffffffffffffb38._0_8_);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)in_stack_fffffffffffffaa0);
  plVar4 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"RAYCAST_CYLINDER",&local_189);
  local_1fa = 1;
  local_1f8 = local_1f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"CYLINDER_PROPAGATE_PICK",&local_1f9);
  local_1fa = 0;
  local_1d0 = local_1f0;
  local_1c8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x4ac87c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffac0,in_stack_fffffffffffffac8,in_stack_fffffffffffffab8);
  addCurveNetworkEdgeRules
            (in_stack_fffffffffffffb58,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb50);
  (**(code **)(*plVar4 + 0x158))(local_168,plVar4,local_188,local_1a8,2);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffa90,
             (shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffa88);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4ac91f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffaa0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffaa0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x4ac946);
  local_468 = (string *)&local_1d0;
  do {
    local_468 = local_468 + -0x20;
    std::__cxx11::string::~string(local_468);
  } while (local_468 != local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_188);
  auVar15._0_8_ = std::allocator<char>::~allocator((allocator<char> *)&local_189);
  auVar15._8_56_ = extraout_var_00;
  nEdges((CurveNetwork *)0x4ac9cc);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x4ac9e9);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::~allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x4aca15);
  nEdges((CurveNetwork *)0x4aca22);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x4aca41);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::~allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x4aca6d);
  nEdges((CurveNetwork *)0x4aca7a);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x4aca99);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>::~allocator
            ((allocator<glm::vec<3,_float,_(glm::qualifier)0>_> *)0x4acac5);
  local_268 = 0;
  while( true ) {
    uVar5 = local_268;
    auVar18 = auVar15._8_56_;
    sVar6 = nEdges((CurveNetwork *)0x4acaee);
    if (sVar6 <= uVar5) break;
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x548),
                        local_268);
    local_270 = (ulong)*pvVar9;
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x630),
                        local_268);
    local_278 = (ulong)*pvVar9;
    vVar19 = pick::indToVec((size_t)in_stack_fffffffffffffac0);
    local_290 = vVar19.field_2;
    auVar14._0_8_ = vVar19._0_8_;
    auVar14._8_56_ = auVar18;
    uVar16 = 0;
    local_298 = vmovlpd_avx(auVar14._0_16_);
    local_288 = local_298;
    local_280 = local_290;
    vVar19 = pick::indToVec((size_t)in_stack_fffffffffffffac0);
    local_2b0 = vVar19.field_2;
    uVar17 = 0;
    auVar2._8_8_ = uVar16;
    auVar2._0_8_ = vVar19._0_8_;
    local_2b8 = vmovlpd_avx(auVar2);
    local_2a8 = local_2b8;
    local_2a0 = local_2b0;
    nNodes((CurveNetwork *)0x4acc56);
    vVar19 = pick::indToVec((size_t)in_stack_fffffffffffffac0);
    local_2d0 = vVar19.field_2;
    auVar15 = ZEXT464((uint)local_2d0);
    auVar1._8_8_ = uVar17;
    auVar1._0_8_ = vVar19._0_8_;
    local_2d8 = vmovlpd_avx(auVar1);
    local_2c4 = local_2d8;
    local_2bc = local_2d0;
    pvVar10 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::operator[](&local_218,local_268);
    pvVar10->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_288;
    pvVar10->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_288._4_4_;
    pvVar10->field_2 = local_280;
    pvVar10 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::operator[](&local_238,local_268);
    pvVar10->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_2a8;
    pvVar10->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_2a8._4_4_;
    pvVar10->field_2 = local_2a0;
    pvVar10 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::operator[](&local_258,local_268);
    pvVar10->field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_2c4;
    pvVar10->field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_2c4._4_4_;
    pvVar10->field_2 = local_2bc;
    local_268 = local_268 + 1;
  }
  peVar11 = std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4acfde);
  paVar20 = &local_2f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"a_color_tail",paVar20);
  (*peVar11->_vptr_ShaderProgram[0x15])(peVar11,local_2f8,&local_218);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  peVar11 = std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4ad061);
  paVar20 = &local_321;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"a_color_tip",paVar20);
  (*peVar11->_vptr_ShaderProgram[0x15])(peVar11,local_320,&local_238);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  peVar11 = std::
            __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4ad0e4);
  this_00 = &local_349;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"a_color_edge",this_00);
  (*peVar11->_vptr_ShaderProgram[0x15])(peVar11,local_348,&local_258);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)this_00);
  fillEdgeGeometryBuffers(this_01,program);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)paVar20);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)paVar20);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             *)paVar20);
  return;
}

Assistant:

void CurveNetwork::preparePick() {
  edgeTailInds.ensureHostBufferPopulated();
  edgeTipInds.ensureHostBufferPopulated();

  // Pick index layout (local indices):
  //   |     --- nodes ---     |      --- edges ---      |
  //   ^                       ^
  //   0                    nNodes()

  // Request pick indices
  size_t totalPickElements = nNodes() + nEdges();
  size_t pickStart = pick::requestPickBufferRange(this, totalPickElements);

  { // Set up node picking program
    nodePickProgram =
        render::engine->requestShader("RAYCAST_SPHERE", addCurveNetworkNodeRules({"SPHERE_PROPAGATE_COLOR"}),
                                      render::ShaderReplacementDefaults::Pick);

    // Fill color buffer with packed point indices
    std::vector<glm::vec3> pickColors;
    pickColors.reserve(nNodes());
    for (size_t i = pickStart; i < pickStart + nNodes(); i++) {
      glm::vec3 val = pick::indToVec(i);
      pickColors.push_back(pick::indToVec(i));
    }

    // Store data in buffers
    nodePickProgram->setAttribute("a_color", pickColors);

    fillNodeGeometryBuffers(*nodePickProgram);
  }

  { // Set up edge picking program
    edgePickProgram =
        render::engine->requestShader("RAYCAST_CYLINDER", addCurveNetworkEdgeRules({"CYLINDER_PROPAGATE_PICK"}),
                                      render::ShaderReplacementDefaults::Pick);

    // Fill color buffer with packed node/edge indices
    std::vector<glm::vec3> edgePickTail(nEdges());
    std::vector<glm::vec3> edgePickTip(nEdges());
    std::vector<glm::vec3> edgePickEdge(nEdges());

    // Fill posiiton and pick index buffers
    for (size_t iE = 0; iE < nEdges(); iE++) {
      size_t eTail = edgeTailInds.data[iE];
      size_t eTip = edgeTipInds.data[iE];

      glm::vec3 colorValTail = pick::indToVec(pickStart + eTail);
      glm::vec3 colorValTip = pick::indToVec(pickStart + eTip);
      glm::vec3 colorValEdge = pick::indToVec(pickStart + nNodes() + iE);
      edgePickTail[iE] = colorValTail;
      edgePickTip[iE] = colorValTip;
      edgePickEdge[iE] = colorValEdge;
    }
    edgePickProgram->setAttribute("a_color_tail", edgePickTail);
    edgePickProgram->setAttribute("a_color_tip", edgePickTip);
    edgePickProgram->setAttribute("a_color_edge", edgePickEdge);

    fillEdgeGeometryBuffers(*edgePickProgram);
  }
}